

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.h
# Opt level: O1

subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
* __thiscall
slang::ast::ValueSymbol::drivers
          (subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
           *__return_storage_ptr__,ValueSymbol *this)

{
  iterator local_d0;
  const_iterator local_90;
  iterator local_50;
  
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::begin(&local_50,&this->driverMap)
  ;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::end(&local_d0,&this->driverMap);
  local_90.map = local_d0.super_const_iterator.map;
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
            (&local_90.path.path,(Base *)&local_d0.super_const_iterator.path);
  std::ranges::
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  ::subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator>
            (__return_storage_ptr__,&local_50,&local_90);
  if (local_90.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_90.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_90.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_d0.super_const_iterator.path.path.
      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_d0.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
    operator_delete(local_d0.super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  if (local_50.super_const_iterator.path.path.
      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_50.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
    operator_delete(local_50.super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::ranges::subrange<DriverIntervalMap::const_iterator> drivers() const {
        return {driverMap.begin(), driverMap.end()};
    }